

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteVar(WatWriter *this,Var *var,NextChar next_char)

{
  string *psVar1;
  char *pcVar2;
  string_view str;
  
  if (var->type_ != Index) {
    psVar1 = Var::name_abi_cxx11_(var);
    str._M_str = (psVar1->_M_dataplus)._M_p;
    str._M_len = psVar1->_M_string_length;
    WriteName(this,str,next_char);
    return;
  }
  pcVar2 = Var::index(var,(char *)var,next_char);
  Writef(this,"%u",(ulong)pcVar2 & 0xffffffff);
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteVar(const Var& var, NextChar next_char) {
  if (var.is_index()) {
    Writef("%" PRIindex, var.index());
    next_char_ = next_char;
  } else {
    WriteName(var.name(), next_char);
  }
}